

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath * __thiscall
testing::internal::FilePath::RemoveDirectoryName(FilePath *__return_storage_ptr__,FilePath *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  char *local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  __s = (this->pathname_)._M_dataplus._M_p;
  pcVar2 = strrchr(__s,0x2f);
  if (pcVar2 == (char *)0x0) {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,__s,__s + (this->pathname_)._M_string_length);
  }
  else {
    local_50 = &local_40;
    sVar3 = strlen(pcVar2 + 1);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,pcVar2 + 1,pcVar2 + sVar3 + 1);
    paVar1 = &(__return_storage_ptr__->pathname_).field_2;
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p = (pointer)paVar1;
    if (local_50 == &local_40) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
      *(undefined8 *)((long)&(__return_storage_ptr__->pathname_).field_2 + 8) = uStack_38;
    }
    else {
      (__return_storage_ptr__->pathname_)._M_dataplus._M_p = local_50;
      (__return_storage_ptr__->pathname_).field_2._M_allocated_capacity =
           CONCAT71(uStack_3f,local_40);
    }
    (__return_storage_ptr__->pathname_)._M_string_length = local_48;
    local_48 = 0;
    local_40 = '\0';
    local_50 = &local_40;
    Normalize(__return_storage_ptr__);
  }
  if ((pcVar2 != (char *)0x0) && (local_50 != &local_40)) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveDirectoryName() const {
  const char* const last_sep = FindLastPathSeparator();
  return last_sep ? FilePath(last_sep + 1) : *this;
}